

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O0

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::Write
          (SerializationCloner<Js::StreamWriter> *this,char16 *str,charcount_t len)

{
  undefined4 local_28;
  uint local_24;
  uint32 padding;
  uint32 unalignedLen;
  uint32 byteLen;
  charcount_t len_local;
  char16 *str_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  padding = len << 1;
  unalignedLen = len;
  _byteLen = str;
  str_local = (char16 *)this;
  StreamWriter::Write<unsigned_int>(this->m_writer,&padding);
  StreamWriter::Write(this->m_writer,_byteLen,(ulong)padding);
  local_24 = padding & 3;
  if (local_24 != 0) {
    local_28 = 0;
    StreamWriter::Write(this->m_writer,&local_28,4 - (ulong)local_24);
  }
  return;
}

Assistant:

void SerializationCloner<Writer>::Write(const char16* str, charcount_t len) const
    {
        uint32 byteLen = static_cast<uint32>(sizeof(char16) * len);
        m_writer->Write(byteLen);
        m_writer->Write(str, byteLen);
        uint32 unalignedLen = byteLen % sizeof(uint32);
        if (unalignedLen)
        {
            uint32 padding = 0;
            m_writer->Write(&padding, sizeof(uint32) - unalignedLen);
        }
    }